

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_chgrp(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  int rc;
  jx9_vfs *pVfs;
  char *zGroup;
  char *zPath;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 2) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
    return 0;
  }
  pvVar2 = jx9_context_user_data(pCtx);
  if ((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 0x78) != 0)) {
    pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
    pcVar4 = jx9_value_to_string(apArg[1],(int *)0x0);
    iVar1 = (**(code **)((long)pvVar2 + 0x78))(pcVar3,pcVar4);
    jx9_result_bool(pCtx,(uint)(iVar1 == 0));
    return 0;
  }
  pcVar3 = jx9_function_name(pCtx);
  jx9_context_throw_error_format
            (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
             pcVar3);
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Vfs_chgrp(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zGroup;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xChgrp == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the desired directory */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Extract the user */
	zGroup = jx9_value_to_string(apArg[1], 0);
	/* Perform the requested operation */
	rc = pVfs->xChgrp(zPath, zGroup);
	/* IO return value */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}